

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

void __thiscall
ncnn::InnerProduct_x86_avx512::InnerProduct_x86_avx512(InnerProduct_x86_avx512 *this)

{
  InnerProduct::InnerProduct(&this->super_InnerProduct);
  (this->super_InnerProduct).super_Layer._vptr_Layer =
       (_func_int **)&PTR__InnerProduct_x86_avx512_00603508;
  (this->scale_in_data).cstep = 0;
  (this->weight_data_tm).data = (void *)0x0;
  (this->weight_data_tm).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
  (this->weight_data_tm).allocator = (Allocator *)0x0;
  (this->weight_data_tm).dims = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).w = 0;
  (this->weight_data_tm).h = 0;
  (this->weight_data_tm).d = 0;
  (this->weight_data_tm).c = 0;
  (this->weight_data_tm).cstep = 0;
  (this->scale_in_data).data = (void *)0x0;
  (this->scale_in_data).refcount = (int *)0x0;
  (this->scale_in_data).elemsize = 0;
  (this->scale_in_data).elempack = 0;
  (this->scale_in_data).allocator = (Allocator *)0x0;
  (this->scale_in_data).dims = 0;
  (this->scale_in_data).w = 0;
  (this->scale_in_data).w = 0;
  (this->scale_in_data).h = 0;
  (this->scale_in_data).d = 0;
  (this->scale_in_data).c = 0;
  (this->super_InnerProduct).super_Layer.support_packing = true;
  this->flatten = (Layer *)0x0;
  return;
}

Assistant:

InnerProduct_x86_avx512::InnerProduct_x86_avx512()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    flatten = 0;
}